

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O0

void __thiscall
cmComputeTargetDepends::AddInterfaceDepends
          (cmComputeTargetDepends *this,int depender_index,cmGeneratorTarget *dependee,
          cmListFileBacktrace *dependee_backtrace,string *config,
          set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted)

{
  bool bVar1;
  reference ppcVar2;
  cmLinkInterface *this_00;
  reference __x;
  pair<std::_Rb_tree_const_iterator<cmLinkItem>,_bool> pVar3;
  undefined1 local_c0 [8];
  cmLinkItem libBT;
  cmLinkItem *lib;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmLinkItem,_std::allocator<cmLinkItem>_> *__range2;
  cmLinkInterface *iface;
  cmGeneratorTarget *depender;
  set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_> *emitted_local;
  string *config_local;
  cmListFileBacktrace *dependee_backtrace_local;
  cmGeneratorTarget *dependee_local;
  int depender_index_local;
  cmComputeTargetDepends *this_local;
  
  ppcVar2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
            operator[](&this->Targets,(long)depender_index);
  this_00 = cmGeneratorTarget::GetLinkInterface(dependee,config,*ppcVar2);
  if (this_00 != (cmLinkInterface *)0x0) {
    __end2 = std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::begin
                       ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_00);
    lib = (cmLinkItem *)
          std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>::end
                    ((vector<cmLinkItem,_std::allocator<cmLinkItem>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
                                       *)&lib), bVar1) {
      __x = __gnu_cxx::
            __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>
            ::operator*(&__end2);
      pVar3 = std::set<cmLinkItem,_std::less<cmLinkItem>,_std::allocator<cmLinkItem>_>::insert
                        (emitted,__x);
      libBT.Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pVar3.first._M_node;
      if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        cmLinkItem::cmLinkItem((cmLinkItem *)local_c0,__x);
        cmListFileBacktrace::operator=((cmListFileBacktrace *)&libBT.Target,dependee_backtrace);
        AddTargetDepend(this,depender_index,(cmLinkItem *)local_c0,true);
        AddInterfaceDepends(this,depender_index,(cmLinkItem *)local_c0,config,emitted);
        cmLinkItem::~cmLinkItem((cmLinkItem *)local_c0);
      }
      __gnu_cxx::
      __normal_iterator<const_cmLinkItem_*,_std::vector<cmLinkItem,_std::allocator<cmLinkItem>_>_>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

void cmComputeTargetDepends::AddInterfaceDepends(
  int depender_index, const cmGeneratorTarget* dependee,
  cmListFileBacktrace const& dependee_backtrace, const std::string& config,
  std::set<cmLinkItem>& emitted)
{
  cmGeneratorTarget const* depender = this->Targets[depender_index];
  if (cmLinkInterface const* iface =
        dependee->GetLinkInterface(config, depender)) {
    for (cmLinkItem const& lib : iface->Libraries) {
      // Don't emit the same library twice for this target.
      if (emitted.insert(lib).second) {
        // Inject the backtrace of the original link dependency whose
        // link interface we are adding.  This indicates the line of
        // code in the project that caused this dependency to be added.
        cmLinkItem libBT = lib;
        libBT.Backtrace = dependee_backtrace;
        this->AddTargetDepend(depender_index, libBT, true);
        this->AddInterfaceDepends(depender_index, libBT, config, emitted);
      }
    }
  }
}